

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

reverse_iterator * __thiscall
immutable::vector<int,_false,_6>::rbegin
          (reverse_iterator *__return_storage_ptr__,vector<int,_false,_6> *this)

{
  iterator local_38;
  vector<int,_false,_6> *local_18;
  vector<int,_false,_6> *this_local;
  
  local_18 = this;
  this_local = (vector<int,_false,_6> *)__return_storage_ptr__;
  end(&local_38,this);
  std::reverse_iterator<immutable::vector_iterator<int,_false,_6>_>::reverse_iterator
            (__return_storage_ptr__,&local_38);
  vector_iterator<int,_false,_6>::~vector_iterator(&local_38);
  return __return_storage_ptr__;
}

Assistant:

reverse_iterator rbegin() const 
        { 
        return reverse_iterator{ end() }; 
        }